

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.cpp
# Opt level: O0

void pzgeom::TPZGeoQuad::ComputeNormal
               (TPZVec<double> *p1,TPZVec<double> *p2,TPZVec<double> *p3,TPZVec<double> *result)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  TPZVec<double> *v1_00;
  TPZVec<double> *result_00;
  TPZVec<double> *this;
  TPZVec<double> *in_RDX;
  TPZVec<double> *in_RSI;
  TPZVec<double> *in_RDI;
  TPZVec<double> *v2_00;
  _func_int **pp_Var4;
  TPZVec<double> normal;
  TPZVec<double> v2;
  TPZVec<double> v1;
  int64_t in_stack_fffffffffffffe78;
  TPZVec<double> *in_stack_fffffffffffffe80;
  TPZVec<double> local_60;
  TPZVec<double> local_40;
  TPZVec<double> *local_18;
  TPZVec<double> *local_10;
  TPZVec<double> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  TPZVec<double>::TPZVec(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  TPZVec<double>::TPZVec(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  TPZVec<double>::TPZVec(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  pdVar3 = TPZVec<double>::operator[](local_8,0);
  dVar1 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](local_10,0);
  dVar2 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](&local_40,0);
  *pdVar3 = dVar1 - dVar2;
  pdVar3 = TPZVec<double>::operator[](local_8,1);
  dVar1 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](local_10,1);
  dVar2 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](&local_40,1);
  *pdVar3 = dVar1 - dVar2;
  pdVar3 = TPZVec<double>::operator[](local_8,2);
  dVar1 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](local_10,2);
  dVar2 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](&local_40,2);
  *pdVar3 = dVar1 - dVar2;
  pdVar3 = TPZVec<double>::operator[](local_10,0);
  dVar1 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](local_18,0);
  v2_00 = (TPZVec<double> *)(dVar1 - *pdVar3);
  v1_00 = (TPZVec<double> *)TPZVec<double>::operator[](&local_60,0);
  v1_00->_vptr_TPZVec = (_func_int **)v2_00;
  result_00 = (TPZVec<double> *)TPZVec<double>::operator[](local_10,1);
  pp_Var4 = result_00->_vptr_TPZVec;
  pdVar3 = TPZVec<double>::operator[](local_18,1);
  dVar1 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](&local_60,1);
  *pdVar3 = (double)pp_Var4 - dVar1;
  pdVar3 = TPZVec<double>::operator[](local_10,2);
  dVar1 = *pdVar3;
  pdVar3 = TPZVec<double>::operator[](local_18,2);
  pp_Var4 = (_func_int **)(dVar1 - *pdVar3);
  this = (TPZVec<double> *)TPZVec<double>::operator[](&local_60,2);
  this->_vptr_TPZVec = pp_Var4;
  VectorialProduct(v1_00,v2_00,result_00);
  VectorialProduct(v1_00,v2_00,result_00);
  TPZVec<double>::~TPZVec(this);
  TPZVec<double>::~TPZVec(this);
  TPZVec<double>::~TPZVec(this);
  return;
}

Assistant:

void TPZGeoQuad::ComputeNormal(TPZVec<REAL> &p1, TPZVec<REAL> &p2,TPZVec<REAL> &p3,TPZVec<REAL> &result){
		TPZVec<REAL> v1(3);
		TPZVec<REAL> v2(3);
		TPZVec<REAL> normal(3);
		v1[0]=p1[0]-p2[0];
		v1[1]=p1[1]-p2[1];
		v1[2]=p1[2]-p2[2];
		v2[0]=p2[0]-p3[0];
		v2[1]=p2[1]-p3[1];
		v2[2]=p2[2]-p3[2];
		VectorialProduct(v1,v2,normal);
		VectorialProduct(v1,normal,result);	
	}